

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_circuit.cpp
# Opt level: O1

void __thiscall
lsim::ModelCircuit::change_port_pin_count(ModelCircuit *this,uint32_t comp_id,uint32_t new_count)

{
  ModelComponent *this_00;
  pin_id_t pin;
  uint index;
  
  this_00 = component_by_id(this,comp_id);
  if (this_00 != (ModelComponent *)0x0) {
    index = this_00->m_outputs + this_00->m_inputs;
    while (new_count < index) {
      index = index - 1;
      pin = ModelComponent::pin_id(this_00,index);
      disconnect_pin(this,pin);
    }
    if (this_00->m_type == 1) {
      ModelComponent::change_output_pins(this_00,new_count);
    }
    else {
      ModelComponent::change_input_pins(this_00,new_count);
    }
    rebuild_port_list(this);
    return;
  }
  __assert_fail("comp",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/model_circuit.cpp"
                ,0x103,"void lsim::ModelCircuit::change_port_pin_count(uint32_t, uint32_t)");
}

Assistant:

void ModelCircuit::change_port_pin_count(uint32_t comp_id, uint32_t new_count) {
    auto comp = component_by_id(comp_id);
    assert(comp);

    // disconnect any ports that are going to be removed
    auto cur_count = comp->num_inputs() + comp->num_outputs();
    while (cur_count > new_count) {
        disconnect_pin(comp->pin_id(--cur_count));
    }

    if (comp->type() == COMPONENT_CONNECTOR_IN) {
        comp->change_output_pins(new_count);
    } else {
        comp->change_input_pins(new_count);
    }

    rebuild_port_list();
}